

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::removeScaleFactors
          (BeagleCPUImpl<double,_1,_0> *this,int *scalingIndices,int count,
          int cumulativeScalingIndex)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  ulong uVar4;
  double __x;
  
  if (0 < count) {
    pdVar1 = this->gScaleBuffers[cumulativeScalingIndex];
    uVar4 = 0;
    do {
      if (0 < this->kPatternCount) {
        pdVar2 = this->gScaleBuffers[scalingIndices[uVar4]];
        lVar3 = 0;
        do {
          __x = pdVar2[lVar3];
          if ((this->kFlags & 0x400) == 0) {
            __x = log(__x);
          }
          pdVar1[lVar3] = pdVar1[lVar3] - __x;
          lVar3 = lVar3 + 1;
        } while (lVar3 < this->kPatternCount);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)count);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::removeScaleFactors(const int* scalingIndices,
                                                          int  count,
                                                          int  cumulativeScalingIndex) {
    REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScalingIndex];
    for(int i=0; i<count; i++) {
        const REALTYPE* scaleBuffer = gScaleBuffers[scalingIndices[i]];
        for(int j=0; j<kPatternCount; j++) {
            if (kFlags & BEAGLE_FLAG_SCALERS_LOG)
                cumulativeScaleBuffer[j] -= scaleBuffer[j];
            else
                cumulativeScaleBuffer[j] -= log(scaleBuffer[j]);
        }
    }

    return BEAGLE_SUCCESS;
}